

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

_Bool is16BitEquivalent(uint orig,uint equiv)

{
  bool bVar1;
  ulong uStack_20;
  uint16_t idx;
  size_t i;
  uint equiv_local;
  uint orig_local;
  
  if (x86_16_bit_eq_lookup[orig] == 0) {
LAB_00201060:
    equiv_local._3_1_ = false;
  }
  else {
    uStack_20 = (ulong)(int)(x86_16_bit_eq_lookup[orig] - 1);
    while( true ) {
      bVar1 = false;
      if (uStack_20 < 0x381) {
        bVar1 = x86_16_bit_eq_tbl[uStack_20].first == orig;
      }
      if (!bVar1) goto LAB_00201060;
      if (x86_16_bit_eq_tbl[uStack_20].second == equiv) break;
      uStack_20 = uStack_20 + 1;
    }
    equiv_local._3_1_ = true;
  }
  return equiv_local._3_1_;
}

Assistant:

static bool is16BitEquivalent(unsigned orig, unsigned equiv)
{
	size_t i;
	uint16_t idx;

	if ((idx = x86_16_bit_eq_lookup[orig]) != 0) {
		for (i = idx - 1; i < ARR_SIZE(x86_16_bit_eq_tbl) && x86_16_bit_eq_tbl[i].first == orig; i++) {
			if (x86_16_bit_eq_tbl[i].second == equiv)
				return true;
		}
	}

	return false;
}